

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cc
# Opt level: O0

void __thiscall VehicleState::Propagator::OE2State(Propagator *this)

{
  initializer_list<int> __l;
  long in_RDI;
  double __x;
  __type _Var1;
  Matrix<double,_3,_1,_0,_3,_1> *this_00;
  double dVar2;
  StorageBaseType *matrix;
  double dVar3;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> PVar4;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> PVar5;
  Vector3d vel;
  Vector3d pos;
  Matrix3d R;
  vector<int,_std::allocator<int>_> order;
  Vector3d angles;
  Vector3d v_pqw;
  Vector3d r_pqw;
  double h;
  double nr;
  double nu_rad;
  double nu;
  double w;
  double Ohm;
  double i;
  double e;
  double a;
  double mu;
  undefined4 in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffffd00;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd10;
  Scalar *in_stack_fffffffffffffd18;
  Scalar *y;
  allocator_type *__a;
  allocator_type *paVar6;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 uVar7;
  allocator_type *this_01;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 uVar8;
  
  dVar3 = *(double *)(in_RDI + 0x90);
  y = *(Scalar **)(in_RDI + 0x50);
  this_01 = *(allocator_type **)(in_RDI + 0x58);
  __x = (*(double *)(in_RDI + 0x78) * 180.0) / 3.141592653589793;
  uVar7 = 2;
  _Var1 = std::pow<double,int>((double)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
  this_00 = (Matrix<double,_3,_1,_0,_3,_1> *)((double)y * (1.0 - _Var1));
  __a = this_01;
  dVar2 = cos(__x);
  matrix = (StorageBaseType *)(dVar3 * ((double)this_00 / ((double)__a * dVar2 + 1.0)));
  paVar6 = this_01;
  dVar3 = cos(__x);
  sqrt((double)matrix * ((double)paVar6 * dVar3 + 1.0));
  cos(__x);
  sin(__x);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(this_00,(Scalar *)__a,y,in_stack_fffffffffffffd18);
  std::pow<double,int>((double)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
  cos(__x);
  Eigen::operator*((double *)CONCAT44(uVar7,in_stack_fffffffffffffd48),matrix);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  sin(__x);
  cos(__x);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(this_00,(Scalar *)__a,y,in_stack_fffffffffffffd18);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(uVar7,in_stack_fffffffffffffd48),(double *)matrix);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(this_00,(Scalar *)__a,y,in_stack_fffffffffffffd18);
  uVar8 = 3;
  std::allocator<int>::allocator((allocator<int> *)0x14b9a6);
  __l._M_len = (size_type)matrix;
  __l._M_array = (iterator)paVar6;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)this_00,__l,__a);
  std::allocator<int>::~allocator((allocator<int> *)0x14b9da);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd00,
             (Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)this_01,
             (vector<int,_std::allocator<int>_> *)CONCAT44(uVar7,in_stack_fffffffffffffd48));
  Util::Angle2RotM((Vector3d *)CONCAT44(uVar8,in_stack_fffffffffffffe88),in_stack_fffffffffffffe80);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffd10);
  PVar4 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                    (in_stack_fffffffffffffd00,
                     (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd00,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  PVar5 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                    (in_stack_fffffffffffffd00,
                     (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            (PVar5.m_rhs,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)PVar4.m_rhs);
  return;
}

Assistant:

void Propagator::OE2State(){

		//extract locals
		double mu = this->mu_; // gravity constant
		double a = this->a_; //semi-major axis
		double e = this->e_; //eccentricity
		double i = this->i_; //inclination
		double Ohm = this->ascend_; //longitude of ascending node
		double w = this->periap_; //argument of periapsis
		double nu = this->nu_; //true anomaly

		//convert true anomaly to radian
		double nu_rad = nu*180.0/M_PI;

		//calculate the norm of position
		double nr = a*(1.0 - pow(e,2)) / (1 + e*cos(nu_rad));

		//angular velocity
		double h = sqrt(mu*nr*(1+e*cos(nu_rad)));

		// radius in perifocal reference frame
		Eigen::Vector3d r_pqw(cos(nu_rad), sin(nu_rad), 0.0);
		r_pqw = pow(h,2)/(mu*(1+e*cos(nu_rad)))*r_pqw;

		// velocity in perifocal reference frame
		Eigen::Vector3d v_pqw(-sin(nu_rad), e+cos(nu_rad), 0);
		v_pqw = v_pqw*(mu/h);

		// generate 313 rotation matric from perifocal to geocentric vector rotation
		Eigen::Vector3d angles(M_PI*Ohm/180, M_PI*i/180, M_PI*w/180);
		std::vector<int> order{3,1,3};
		Eigen::Matrix3d R = Util::Angle2RotM(angles, order);

		// rotate vectors
		Eigen::Vector3d pos = R*r_pqw;
		Eigen::Vector3d vel = R*v_pqw;

		//Display
		// std::cout << "position: \n" << pos << std::endl;
		// std::cout << "velocity: \n" << vel << std::endl;

		//Assign

	}